

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

Value * __thiscall FReader::FindKey(FReader *this,char *key)

{
  FJSONObject *pFVar1;
  uint16_t uVar2;
  FJSONObject *pFVar3;
  Value *pVVar4;
  SizeType SVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar6;
  uint uVar7;
  MemberIterator it;
  undefined8 local_20;
  undefined8 local_18;
  
  pFVar3 = (this->mObjects).Array;
  uVar7 = (this->mObjects).Count - 1;
  pFVar1 = pFVar3 + uVar7;
  pGVar6 = pFVar3[uVar7].mObject;
  uVar2 = (pGVar6->data_).f.flags;
  if (uVar2 == 4) {
    uVar7 = pFVar1->mIndex;
    SVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar6);
    if (uVar7 < SVar5) {
      SVar5 = pFVar1->mIndex;
      pFVar1->mIndex = SVar5 + 1;
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator[](pFVar1->mObject,SVar5);
      return pGVar6;
    }
  }
  else if (uVar2 == 3) {
    if (key == (char *)0x0) {
      pVVar4 = this->mKeyValue;
      this->mKeyValue = (Value *)0x0;
      return pVVar4;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&stack0xffffffffffffffe8,(Ch *)pGVar6);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&stack0xffffffffffffffe0);
    if (local_18 == local_20) {
      return (Value *)0x0;
    }
    return (Value *)(local_18 + 0x18);
  }
  return (Value *)0x0;
}

Assistant:

rapidjson::Value *FindKey(const char *key)
	{
		FJSONObject &obj = mObjects.Last();
		
		if (obj.mObject->IsObject())
		{
			if (key == nullptr)
			{
				// we are performing an iteration of the object through GetKey.
				auto p = mKeyValue;
				mKeyValue = nullptr;
				return p;
			}
			else
			{
				// Find the given key by name;
				auto it = obj.mObject->FindMember(key);
				if (it == obj.mObject->MemberEnd()) return nullptr;
				return &it->value;
			}
		}
		else if (obj.mObject->IsArray() && (unsigned)obj.mIndex < obj.mObject->Size())
		{
			return &(*obj.mObject)[obj.mIndex++];
		}
		return nullptr;
	}